

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  utf8proc_property_t *puVar6;
  utf8proc_property_t *puVar7;
  utf8proc_ssize_t uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  byte bVar13;
  uint *puVar14;
  long lVar15;
  uint uc;
  long lVar16;
  ushort uVar17;
  long local_40;
  
  local_40 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    local_40 = 0;
    for (lVar11 = 0; lVar11 < length; lVar11 = lVar11 + 1) {
      iVar4 = buffer[lVar11];
      if (lVar11 < length + -1 && iVar4 == 0xd) {
        if (buffer[lVar11 + 1] == 10) {
          lVar11 = lVar11 + 1;
        }
LAB_0013d2ed:
        lVar12 = local_40 + 1;
        if ((char)options < '\0') {
          if ((options >> 8 & 1) == 0) {
            buffer[local_40] = 0x2028;
            local_40 = lVar12;
          }
          else {
            buffer[local_40] = 10;
            local_40 = lVar12;
          }
        }
        else if ((options >> 8 & 1) == 0) {
          buffer[local_40] = 0x20;
          local_40 = lVar12;
        }
        else {
          buffer[local_40] = 0x2029;
          local_40 = lVar12;
        }
      }
      else {
        if ((((iVar4 == 10) || (iVar4 == 0xd)) || (iVar4 == 0x85)) ||
           (((options >> 9 & 1) != 0 && (iVar4 - 0xbU < 2)))) goto LAB_0013d2ed;
        if (((options >> 9 & 1) == 0) || (0x20 < iVar4 - 0x7fU && 0x1f < iVar4)) {
          buffer[local_40] = iVar4;
LAB_0013d366:
          local_40 = local_40 + 1;
        }
        else if (iVar4 == 9) {
          buffer[local_40] = 0x20;
          goto LAB_0013d366;
        }
      }
    }
  }
  if ((options & UTF8PROC_COMPOSE) != 0) {
    lVar11 = local_40;
    if (local_40 < 1) {
      lVar11 = 0;
    }
    uVar17 = 0xffff;
    local_40 = 0;
    puVar7 = (utf8proc_property_t *)0x0;
    puVar14 = (uint *)0x0;
    for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 1) {
      uVar5 = buffer[lVar12];
      puVar6 = unsafe_get_property(uVar5);
      uVar1 = puVar6->combining_class;
      if ((puVar14 == (uint *)0x0) || ((short)uVar1 <= (short)uVar17)) goto LAB_0013d4eb;
      uVar10 = *puVar14;
      if ((uVar5 - 0x1176 < 0xffffffeb) || (uVar10 - 0x1113 < 0xffffffed)) {
        if (((uVar10 - 0xac00 < 0x2ba4) && (0xffffffe3 < uVar5 - 0x11c3)) &&
           ((short)((uVar10 - 0xac00 & 0xffff) % 0x1c) == 0)) {
          uVar5 = (uVar5 + uVar10) - 0x11a7;
          goto LAB_0013d413;
        }
        if (puVar7 == (utf8proc_property_t *)0x0) {
          puVar7 = unsafe_get_property(uVar10);
        }
        uVar2 = puVar7->comb_index;
        if (-1 < (short)uVar2) {
          uVar3 = puVar6->comb_index;
          if (-2 < (short)uVar3) goto LAB_0013d4eb;
          uVar10 = (uVar3 & 0x3fff) - (uint)utf8proc_combinations[(uint)uVar2];
          if (((int)uVar10 < 0) || (utf8proc_combinations[(ulong)uVar2 + 1] < uVar10))
          goto LAB_0013d4eb;
          uc = (uint)utf8proc_combinations[(ulong)(uVar2 + uVar10) + 2];
          if ((uVar3 >> 0xe & 1) != 0) {
            uc = CONCAT22(utf8proc_combinations[(ulong)(uVar2 + uVar10) + 2],
                          utf8proc_combinations[(ulong)(uVar2 + uVar10 + 2) + 1]);
          }
          if (((int)uc < 1) ||
             (((options & UTF8PROC_STABLE) != 0 &&
              (puVar6 = unsafe_get_property(uc), (puVar6->field_0x14 & 2) != 0))))
          goto LAB_0013d4eb;
          *puVar14 = uc;
          goto LAB_0013d416;
        }
LAB_0013d4eb:
        buffer[local_40] = uVar5;
        if ((short)uVar17 < (short)uVar1) {
          uVar17 = uVar1;
        }
        uVar17 = -(ushort)(uVar1 == 0) | uVar17;
        if (uVar1 == 0) {
          puVar14 = (uint *)(buffer + local_40);
          puVar7 = (utf8proc_property_t *)0x0;
        }
        local_40 = local_40 + 1;
      }
      else {
        uVar5 = (uVar10 * 0x15 + uVar5) * 0x1c - 0x28469c;
LAB_0013d413:
        *puVar14 = uVar5;
LAB_0013d416:
        puVar7 = (utf8proc_property_t *)0x0;
      }
    }
  }
  lVar11 = 0;
  if (0 < local_40) {
    lVar11 = local_40;
  }
  if ((options >> 0xb & 1) == 0) {
    lVar16 = 0;
    for (lVar12 = 0; lVar11 != lVar12; lVar12 = lVar12 + 1) {
      uVar8 = utf8proc_encode_char(buffer[lVar12],(utf8proc_uint8_t *)(lVar16 + (long)buffer));
      lVar16 = lVar16 + uVar8;
    }
  }
  else {
    lVar12 = 1;
    lVar16 = 0;
    for (lVar9 = 0; lVar11 != lVar9; lVar9 = lVar9 + 1) {
      uVar5 = buffer[lVar9];
      if ((int)uVar5 < 0) {
LAB_0013d69a:
        lVar15 = 0;
      }
      else {
        bVar13 = (byte)uVar5;
        lVar15 = lVar12;
        if (uVar5 < 0x80) {
          *(byte *)((long)buffer + lVar16) = bVar13;
        }
        else if (uVar5 < 0x800) {
          *(byte *)((long)buffer + lVar16) = (byte)(uVar5 >> 6) | 0xc0;
          *(byte *)((long)buffer + lVar16 + 1) = bVar13 & 0x3f | 0x80;
          lVar15 = 2;
        }
        else if (uVar5 == 0xfffe) {
          *(undefined1 *)((long)buffer + lVar16) = 0xfe;
        }
        else if (uVar5 == 0xffff) {
          *(undefined1 *)((long)buffer + lVar16) = 0xff;
        }
        else if (uVar5 < 0x10000) {
          *(byte *)((long)buffer + lVar16) = (byte)(uVar5 >> 0xc) | 0xe0;
          *(byte *)((long)buffer + lVar16 + 1) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
          *(byte *)((long)buffer + lVar16 + 2) = bVar13 & 0x3f | 0x80;
          lVar15 = 3;
        }
        else {
          if (0x10ffff < uVar5) goto LAB_0013d69a;
          *(byte *)((long)buffer + lVar16) = (byte)(uVar5 >> 0x12) | 0xf0;
          *(byte *)((long)buffer + lVar16 + 1) = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
          *(byte *)((long)buffer + lVar16 + 2) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
          *(byte *)((long)buffer + lVar16 + 3) = bVar13 & 0x3f | 0x80;
          lVar15 = 4;
        }
      }
      lVar16 = lVar16 + lVar15;
    }
  }
  *(undefined1 *)((long)buffer + lVar16) = 0;
  return lVar16;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = (current_property->comb_index & 0x3FFF) - utf8proc_combinations[sidx];
          if (idx >= 0 && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2;
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}